

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.h
# Opt level: O0

void dijkstra_sync(vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   *adj_list,int from,vector<int,_std::allocator<int>_> *dists)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  reference pvVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  reference rVar10;
  int local_ac;
  int j;
  int weight;
  int to;
  _Bit_type local_98;
  undefined4 local_8c;
  reference local_88;
  int local_78;
  int local_74;
  int v;
  int i;
  Timer timer;
  int curr_v;
  bool local_51;
  undefined1 local_50 [8];
  vector<bool,_std::allocator<bool>_> used;
  int vs;
  vector<int,_std::allocator<int>_> *dists_local;
  int from_local;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *adj_list_local;
  
  sVar6 = std::
          vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
          ::size(adj_list);
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ._4_4_ = (int)sVar6;
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ._0_4_ = 999999;
  std::vector<int,_std::allocator<int>_>::assign
            (dists,(long)used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage._4_4_,
             (value_type *)
             &used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](dists,(long)from);
  *pvVar7 = 0;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_50);
  local_51 = false;
  std::vector<bool,_std::allocator<bool>_>::assign
            ((vector<bool,_std::allocator<bool>_> *)local_50,
             (long)used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_end_of_storage._4_4_,&local_51);
  Timer::Timer((Timer *)&v);
  local_74 = 0;
  do {
    if (used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._4_4_ <= local_74) {
      local_8c = 0;
LAB_0010288a:
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_50);
      return;
    }
    timer.start.__d.__r._0_4_ = -1;
    for (local_78 = 0;
        local_78 <
        used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._4_4_; local_78 = local_78 + 1) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_50,(long)local_78);
      local_88 = rVar10;
      bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_88);
      bVar4 = false;
      if ((!bVar5) && (bVar4 = true, (int)timer.start.__d.__r != -1)) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](dists,(long)local_78);
        iVar1 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (dists,(long)(int)timer.start.__d.__r);
        bVar4 = iVar1 < *pvVar7;
      }
      if (bVar4) {
        timer.start.__d.__r._0_4_ = local_78;
      }
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       (dists,(long)(int)timer.start.__d.__r);
    if (*pvVar7 == 999999) {
      local_8c = 1;
      goto LAB_0010288a;
    }
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_50,
                        (long)(int)timer.start.__d.__r);
    _weight = rVar10;
    std::_Bit_reference::operator=((_Bit_reference *)&weight,true);
    local_ac = 0;
    while( true ) {
      pvVar8 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[](adj_list,(long)(int)timer.start.__d.__r);
      sVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(pvVar8);
      if (sVar6 <= (ulong)(long)local_ac) break;
      pvVar8 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[](adj_list,(long)(int)timer.start.__d.__r);
      pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar8,(long)local_ac);
      iVar1 = pvVar9->first;
      pvVar8 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[](adj_list,(long)(int)timer.start.__d.__r);
      pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar8,(long)local_ac);
      iVar2 = pvVar9->second;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (dists,(long)(int)timer.start.__d.__r);
      iVar3 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](dists,(long)iVar1);
      if (iVar3 + iVar2 < *pvVar7) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (dists,(long)(int)timer.start.__d.__r);
        iVar3 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](dists,(long)iVar1);
        *pvVar7 = iVar3 + iVar2;
      }
      local_ac = local_ac + 1;
    }
    local_74 = local_74 + 1;
  } while( true );
}

Assistant:

void dijkstra_sync(const vector<vector<pair<int, int>>>& adj_list, int from, vector<int>& dists){
    int vs = adj_list.size();
    dists.assign(vs, MAX_INT);
    dists[from] = 0;
    vector<bool> used;
    used.assign(vs, false);
    int curr_v;

    Timer timer = Timer();

    for (int i=0; i<vs; i++){
        // search unused
        curr_v = -1;

        for (int v=0; v<vs; v++) {
            if (!used[v] && (curr_v == -1 || dists[v] < dists[curr_v])) {
                curr_v = v;
            }
        }
        // have visited all reachable vertexes
        if (dists[curr_v] == MAX_INT){
            return;
        }

        used[curr_v] = true;

        int to, weight;
        // Search least path
        for (int j=0; j<adj_list[curr_v].size(); j++){
            to = adj_list[curr_v][j].first;
            weight = adj_list[curr_v][j].second;
            if (dists[curr_v] + weight < dists[to]){
                // Relax
                dists[to] = dists[curr_v] + weight;
            }
        }
    }
}